

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O0

void ini_inv(trobj *trop,short *nocreate)

{
  short sVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  obj *obj_00;
  bool bVar5;
  ulong local_30;
  long trquan;
  int i;
  int otyp;
  obj *obj;
  short *nocreate_local;
  trobj *trop_local;
  
  local_30 = (ulong)(trop->field_0x4 & 0x3f);
  nocreate_local = &trop->trotyp;
  do {
    if (*(char *)((long)nocreate_local + 3) == '\0') {
      return;
    }
    if (*nocreate_local == 0) {
      _i = mkobj(level,*(char *)((long)nocreate_local + 3),'\0');
      sVar1 = _i->otyp;
      while( true ) {
        trquan._4_4_ = (int)sVar1;
        bVar5 = true;
        if ((((((trquan._4_4_ != 0x1c2) && (bVar5 = true, trquan._4_4_ != *nocreate)) &&
              (bVar5 = true, trquan._4_4_ != nocreate[1])) &&
             ((bVar5 = true, trquan._4_4_ != nocreate[2] &&
              (bVar5 = true, trquan._4_4_ != nocreate[3])))) &&
            (((trquan._4_4_ != 0xaa || (bVar5 = true, flags.elbereth_enabled == '\0')) &&
             (((bVar5 = true, trquan._4_4_ != 0x134 && (bVar5 = true, trquan._4_4_ != 0x141)) &&
              (bVar5 = true, trquan._4_4_ != 0x161)))))) &&
           ((((((bVar5 = true, trquan._4_4_ != 0x162 && (bVar5 = true, trquan._4_4_ != 0x17c)) &&
               (bVar5 = true, trquan._4_4_ != 0x1bc)) &&
              ((bVar5 = true, trquan._4_4_ != 0xac && (bVar5 = true, trquan._4_4_ != 0xab)))) &&
             ((bVar5 = true, trquan._4_4_ != 0x1c3 &&
              ((trquan._4_4_ != 0x157 || (bVar5 = true, urole.malenum != 0x160)))))) &&
            (((trquan._4_4_ != 0x187 || (bVar5 = true, urole.malenum != 0x168)) &&
             ((bVar5 = false, _i->oclass == '\n' &&
              (bVar5 = true, objects[trquan._4_4_].oc_oc2 < '\x04')))))))) {
          bVar2 = restricted_spell_discipline(trquan._4_4_);
          bVar5 = bVar2 != '\0';
        }
        if (!bVar5) break;
        dealloc_obj(_i);
        _i = mkobj(level,*(char *)((long)nocreate_local + 3),'\0');
        sVar1 = _i->otyp;
      }
      if ((((byte)objects[trquan._4_4_].field_0x10 >> 5 & 1) != 0) && (_i->spe < '\x01')) {
        iVar3 = rne(3);
        _i->spe = (schar)iVar3;
      }
      if (trquan._4_4_ == 0xb7) {
LAB_0032a355:
        *nocreate = 0xb8;
      }
      else if (trquan._4_4_ == 0xb8) {
        *nocreate = 0xb7;
        nocreate[1] = 0x19e;
        nocreate[2] = 0x13a;
      }
      else if ((trquan._4_4_ == 0x13a) || (trquan._4_4_ == 0x1c9)) goto LAB_0032a355;
      if ((_i->oclass == '\x04') || (_i->oclass == '\n')) {
        nocreate[3] = sVar1;
      }
    }
    else {
      trquan._4_4_ = (int)*nocreate_local;
      if (urace.malenum != 0x10b) {
        trquan._0_4_ = 0;
        while (inv_subs[(int)trquan].race_pm != -1) {
          if ((inv_subs[(int)trquan].race_pm == urace.malenum) &&
             (trquan._4_4_ == inv_subs[(int)trquan].item_otyp)) {
            trquan._4_4_ = (int)inv_subs[(int)trquan].subs_otyp;
            break;
          }
          trquan._0_4_ = (int)trquan + 1;
        }
      }
      _i = mksobj(level,trquan._4_4_,'\x01','\0');
    }
    if (*(char *)((long)nocreate_local + 3) == '\f') {
      _i->quan = u.umoney0;
    }
    else {
      *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xffffff7f | 0x80;
      *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xffffffbf | 0x40;
      *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xffffffdf | 0x20;
      if (((byte)objects[trquan._4_4_].field_0x10 >> 2 & 1) != 0) {
        *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xffffffef | 0x10;
      }
      *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xfffffffe;
      if (_i->oprops != 0) {
        _i->oprops = 0;
      }
      if (((*(uint *)&_i->field_0x4a >> 0xf & 1) != 0) && (u.ualign.type != -1)) {
        *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xffff7fff;
      }
      if ((_i->oclass == '\x02') || (_i->oclass == '\x06')) {
        _i->quan = (int)local_30;
        local_30 = 1;
      }
      else if (((_i->oclass == '\r') &&
               ((((_i->otyp == 0x20f || (_i->otyp == 0x210)) || (_i->otyp == 0x212)) ||
                (_i->otyp == 0x211)))) && (_i->otyp != 0x212)) {
        _i->quan = 1;
      }
      if (_i->otyp == 0x7a) {
        *(uint *)&_i->field_0x4a = *(uint *)&_i->field_0x4a & 0xfffffffe | 1;
      }
      if ((char)nocreate_local[1] != '\x7f') {
        _i->spe = (schar)nocreate_local[1];
      }
      if (*(byte *)(nocreate_local + 2) >> 6 != 2) {
        *(uint *)&_i->field_0x4a =
             *(uint *)&_i->field_0x4a & 0xfffffffd | (*(byte *)(nocreate_local + 2) >> 6 & 1) << 1;
      }
    }
    uVar4 = weight(_i);
    _i->owt = uVar4;
    obj_00 = addinv(_i);
    if ((obj_descr[objects[trquan._4_4_].oc_descr_idx].oc_descr != (char *)0x0) &&
       ((*(uint *)&obj_00->field_0x4a >> 4 & 1) != 0)) {
      knows_object(trquan._4_4_);
    }
    knows_object(0x142);
    if ((obj_00->oclass == '\x03') && (u.roleplay.nudist == '\0')) {
      if ((obj_00->oclass == '\x03') &&
         ((objects[obj_00->otyp].oc_subtyp == '\x01' && (uarms == (obj *)0x0)))) {
        setworn(obj_00,8);
        if (uswapwep != (obj *)0x0) {
          setuswapwep((obj *)0x0);
        }
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\x02' && (uarmh == (obj *)0x0)))) {
        setworn(obj_00,4);
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\x03' && (uarmg == (obj *)0x0)))) {
        setworn(obj_00,0x10);
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\x06' && (uarmu == (obj *)0x0)))) {
        setworn(obj_00,0x40);
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\x05' && (uarmc == (obj *)0x0)))) {
        setworn(obj_00,2);
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\x04' && (uarmf == (obj *)0x0)))) {
        setworn(obj_00,0x20);
      }
      else if ((obj_00->oclass == '\x03') &&
              ((objects[obj_00->otyp].oc_subtyp == '\0' && (uarm == (obj *)0x0)))) {
        setworn(obj_00,1);
      }
    }
    if ((obj_00->oclass == '\x02') ||
       ((((obj_00->oclass == '\x06' && (objects[obj_00->otyp].oc_subtyp != '\0')) ||
         (trquan._4_4_ == 0xf4)) || ((trquan._4_4_ == 0x212 || (trquan._4_4_ == 0x213)))))) {
      if (((((obj_00->oclass == '\x02') || (obj_00->oclass == '\r')) &&
           ((-0x19 < objects[obj_00->otyp].oc_subtyp && (objects[obj_00->otyp].oc_subtyp < -0x15))))
          || (((obj_00->oclass == '\x02' || (obj_00->oclass == '\x06')) &&
              ((-0x1c < objects[obj_00->otyp].oc_subtyp && (objects[obj_00->otyp].oc_subtyp < -0x18)
               ))))) || ((obj_00->oclass == '\x02' && (1 < obj_00->quan)))) {
        if (uquiver == (obj *)0x0) {
          setuqwep(obj_00);
        }
      }
      else if ((uwep == (obj *)0x0) && (u.roleplay.pacifist == '\0')) {
        setuwep(obj_00);
      }
      else if (uswapwep == (obj *)0x0) {
        setuswapwep(obj_00);
      }
    }
    if ((obj_00->oclass == '\n') && (obj_00->otyp != 0x1bc)) {
      initialspell(obj_00);
    }
    if ((obj_00->otyp == 0xee) && (u.roleplay.blindfolded != '\0')) {
      setworn(obj_00,0x80000);
    }
    local_30 = local_30 - 1;
    if (local_30 == 0) {
      local_30 = (ulong)(*(byte *)(nocreate_local + 6) & 0x3f);
      nocreate_local = nocreate_local + 4;
    }
  } while( true );
}

Assistant:

static void ini_inv(const struct trobj *trop, short nocreate[4])
{
	struct obj *obj;
	int otyp, i;
	long trquan = trop->trquan;

	while (trop->trclass) {
		if (trop->trotyp != UNDEF_TYP) {
			otyp = (int)trop->trotyp;
			if (urace.malenum != PM_HUMAN) {
			    /* substitute specific items for generic ones */
			    for (i = 0; inv_subs[i].race_pm != NON_PM; ++i)
				if (inv_subs[i].race_pm == urace.malenum &&
					otyp == inv_subs[i].item_otyp) {
				    otyp = inv_subs[i].subs_otyp;
				    break;
				}
			}
			obj = mksobj(level, otyp, TRUE, FALSE);
		} else {	/* UNDEF_TYP */
		/*
		 * For random objects, do not create certain overly powerful
		 * items: wand of wishing, ring of levitation, or the
		 * polymorph/polymorph control combination.  Specific objects,
		 * i.e. the discovery wishing, are still OK.
		 * Also, don't get a couple of really useless items.  (Note:
		 * punishment isn't "useless".  Some players who start out with
		 * one will immediately read it and use the iron ball as a
		 * weapon.)
		 */
			obj = mkobj(level, trop->trclass, FALSE);
			otyp = obj->otyp;
			while (otyp == WAN_WISHING
				|| otyp == nocreate[0]
				|| otyp == nocreate[1]
				|| otyp == nocreate[2]
				|| otyp == nocreate[3]
				|| (otyp == RIN_LEVITATION && flags.elbereth_enabled)
				/* 'useless' items */
				|| otyp == POT_HALLUCINATION
				|| otyp == POT_ACID
				|| otyp == SCR_FLOOD
				|| otyp == SCR_FIRE
				|| otyp == SCR_BLANK_PAPER
				|| otyp == SPE_BLANK_PAPER
				|| otyp == RIN_AGGRAVATE_MONSTER
				|| otyp == RIN_HUNGER
				|| otyp == WAN_NOTHING
				/* Monks don't use weapons */
				|| (otyp == SCR_ENCHANT_WEAPON &&
				    Role_if (PM_MONK))
				/* wizard patch -- they already have one */
				|| (otyp == SPE_FORCE_BOLT &&
				    Role_if (PM_WIZARD))
				/* powerful spells are either useless to
				   low level players or unbalancing; also
				   spells in restricted skill categories */
				|| (obj->oclass == SPBOOK_CLASS &&
				    (objects[otyp].oc_level > 3 ||
				    restricted_spell_discipline(otyp)))
							) {
				dealloc_obj(obj);
				obj = mkobj(level, trop->trclass, FALSE);
				otyp = obj->otyp;
			}

			/* Don't start with +0 or negative rings */
			if (objects[otyp].oc_charged && obj->spe <= 0)
				obj->spe = rne(3);

			/* Heavily relies on the fact that 1) we create wands
			 * before rings, 2) that we create rings before
			 * spellbooks, and that 3) not more than 1 object of a
			 * particular symbol is to be prohibited.  (For more
			 * objects, we need more nocreate variables...)
			 */
			switch (otyp) {
			    case WAN_POLYMORPH:
			    case RIN_POLYMORPH:
			    case POT_POLYMORPH:
				nocreate[0] = RIN_POLYMORPH_CONTROL;
				break;
			    case RIN_POLYMORPH_CONTROL:
				nocreate[0] = RIN_POLYMORPH;
				nocreate[1] = SPE_POLYMORPH;
				nocreate[2] = POT_POLYMORPH;
			}
			/* Don't have 2 of the same ring or spellbook */
			if (obj->oclass == RING_CLASS ||
			    obj->oclass == SPBOOK_CLASS)
				nocreate[3] = otyp;
		}

		if (trop->trclass == COIN_CLASS) {
			/* no "blessed" or "identified" money */
			obj->quan = u.umoney0;
		} else {
			obj->dknown = obj->bknown = obj->rknown = 1;
			if (objects[otyp].oc_uses_known) obj->known = 1;
			obj->cursed = 0;
			if (obj->oprops) obj->oprops = 0L;
			if (obj->opoisoned && u.ualign.type != A_CHAOTIC)
			    obj->opoisoned = 0;
			if (obj->oclass == WEAPON_CLASS ||
				obj->oclass == TOOL_CLASS) {
			    obj->quan = trquan;
			    trquan = 1;
			} else if (obj->oclass == GEM_CLASS &&
				is_graystone(obj) && obj->otyp != FLINT) {
			    obj->quan = 1L;
			}
			if (obj->otyp == STRIPED_SHIRT)
			    obj->cursed = TRUE;
			if (trop->trspe != UNDEF_SPE)
			    obj->spe = trop->trspe;
			if (trop->trbless != UNDEF_BLESS)
			    obj->blessed = trop->trbless;
		}
		/* defined after setting otyp+quan + blessedness */
		obj->owt = weight(obj);
		obj = addinv(obj);

		/* Make the type known if necessary */
		if (OBJ_DESCR(objects[otyp]) && obj->known)
			knows_object(otyp);

		/* pre-ID oil as it's easy to check anyway */
		knows_object(POT_OIL);

		if (obj->oclass == ARMOR_CLASS && !u.roleplay.nudist) {
			if (is_shield(obj) && !uarms) {
				setworn(obj, W_ARMS);
				if (uswapwep) setuswapwep(NULL);
			} else if (is_helmet(obj) && !uarmh)
				setworn(obj, W_ARMH);
			else if (is_gloves(obj) && !uarmg)
				setworn(obj, W_ARMG);
			else if (is_shirt(obj) && !uarmu)
				setworn(obj, W_ARMU);
			else if (is_cloak(obj) && !uarmc)
				setworn(obj, W_ARMC);
			else if (is_boots(obj) && !uarmf)
				setworn(obj, W_ARMF);
			else if (is_suit(obj) && !uarm)
				setworn(obj, W_ARM);
		}

		if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
			otyp == TIN_OPENER || otyp == FLINT || otyp == ROCK) {
		    if (is_ammo(obj) || is_missile(obj) ||
			/* starting weapon stacks are usually for throwing */
			(obj->oclass == WEAPON_CLASS && obj->quan > 1)) {
			if (!uquiver) setuqwep(obj);
		    } else if (!uwep && !u.roleplay.pacifist) setuwep(obj);
		    else if (!uswapwep) setuswapwep(obj);
		}
		if (obj->oclass == SPBOOK_CLASS &&
				obj->otyp != SPE_BLANK_PAPER)
		    initialspell(obj);

		if (obj->otyp == BLINDFOLD && u.roleplay.blindfolded)
		    setworn(obj, W_TOOL);

		if (--trquan) continue;	/* make a similar object */
		trop++;
		trquan = trop->trquan;
	}
}